

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_api.h
# Opt level: O0

void __thiscall dummy_api::~dummy_api(dummy_api *this)

{
  connection *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__dummy_api_001379f8;
  std::__cxx11::string::~string((string *)(in_RDI + 0x110));
  cppcms::impl::cgi::connection::~connection(in_RDI);
  return;
}

Assistant:

dummy_api(cppcms::service &srv,std::map<std::string,std::string> env,std::string &output,bool mark_chunks=false,bool write_eof=false) :
		cppcms::impl::cgi::connection(srv),
		output_(&output),
		write_eof_(write_eof),
		mark_chunks_(mark_chunks),
		headers_written_(false)
	{
		for(std::map<std::string,std::string>::iterator p=env.begin();p!=env.end();++p)
			env_.add(pool_.add(p->first),pool_.add(p->second));

	}